

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::fixBlockUniformLayoutMatrix
          (TParseContext *this,TQualifier *qualifier,TTypeList *originTypeList,
          TTypeList *tmpTypeList)

{
  _Vector_impl_data *p_Var1;
  _Vector_impl_data *p_Var2;
  ulong uVar3;
  TType *pTVar4;
  int iVar5;
  int iVar6;
  pointer pTVar7;
  long lVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TQualifier *qualifier_00;
  TType *pTVar9;
  TTypeList *pTVar10;
  pointer pTVar11;
  _Vector_impl_data *p_Var12;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  uint uVar13;
  TQualifier *__fn;
  TParseContext *this_00;
  void *in_R8;
  ulong uVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  if (tmpTypeList == (TTypeList *)0x0) {
    pTVar7 = (originTypeList->
             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar11 = (originTypeList->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    __fn = qualifier;
  }
  else {
    pTVar7 = (originTypeList->
             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar11 = (originTypeList->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    __fn = (TQualifier *)
           ((long)(tmpTypeList->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(tmpTypeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    if ((TQualifier *)((long)pTVar11 - (long)pTVar7) != __fn) {
      __assert_fail("tmpTypeList == nullptr || originTypeList->size() == tmpTypeList->size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                    ,0x2685,
                    "void glslang::TParseContext::fixBlockUniformLayoutMatrix(TQualifier &, TTypeList *, TTypeList *)"
                   );
    }
  }
  if (pTVar11 != pTVar7) {
    p_Var1 = &(originTypeList->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data;
    p_Var2 = &(tmpTypeList->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data;
    uVar13 = 1;
    uVar14 = 0;
    do {
      if ((qualifier->field_0x10 & 0xf) != 0) {
        if (tmpTypeList == (TTypeList *)0x0) {
          iVar5 = (*(pTVar7[uVar14].type)->_vptr_TType[0x1c])();
          if ((char)iVar5 == '\0') {
            iVar5 = (*(p_Var1->_M_start[uVar14].type)->_vptr_TType[7])();
            if (iVar5 != 0xf) goto LAB_0043478a;
          }
          iVar5 = (*(p_Var1->_M_start[uVar14].type)->_vptr_TType[10])();
          lVar8 = CONCAT44(extraout_var_00,iVar5);
          p_Var12 = p_Var1;
        }
        else {
          iVar5 = (*(p_Var2->_M_start[uVar14].type)->_vptr_TType[0x1c])();
          if ((char)iVar5 == '\0') {
            iVar5 = (*(p_Var2->_M_start[uVar14].type)->_vptr_TType[7])();
            if (iVar5 != 0xf) goto LAB_0043478a;
          }
          iVar5 = (*(p_Var2->_M_start[uVar14].type)->_vptr_TType[10])();
          lVar8 = CONCAT44(extraout_var,iVar5);
          p_Var12 = p_Var2;
        }
        if (*(ulong *)(lVar8 + 8) < 0x2000000000000000) {
          uVar3 = *(ulong *)&qualifier->field_0x8;
          iVar5 = (*(p_Var12->_M_start[uVar14].type)->_vptr_TType[10])();
          *(ulong *)(CONCAT44(extraout_var_01,iVar5) + 8) =
               *(ulong *)(CONCAT44(extraout_var_01,iVar5) + 8) & 0x1fffffffffffffff |
               uVar3 & 0xe000000000000000;
        }
      }
LAB_0043478a:
      iVar5 = (*(p_Var1->_M_start[uVar14].type)->_vptr_TType[7])();
      if (iVar5 == 0xf) {
        iVar6 = (*(p_Var1->_M_start[uVar14].type)->_vptr_TType[10])();
        iVar5 = 0;
        __child_stack = extraout_RDX;
        qualifier_00 = qualifier;
        if (0x1fffffffffffffff < *(ulong *)(CONCAT44(extraout_var_02,iVar6) + 8)) {
          iVar5 = 0;
          iVar6 = (*(p_Var1->_M_start[uVar14].type)->_vptr_TType[10])();
          qualifier_00 = (TQualifier *)CONCAT44(extraout_var_03,iVar6);
          __child_stack = extraout_RDX_00;
        }
        if (tmpTypeList == (TTypeList *)0x0) {
          iVar5 = TType::clone(p_Var1->_M_start[uVar14].type,(__fn *)__fn,__child_stack,iVar5,in_R8)
          ;
          pTVar9 = (TType *)CONCAT44(extraout_var_04,iVar5);
        }
        else {
          pTVar9 = p_Var2->_M_start[uVar14].type;
        }
        pTVar4 = p_Var1->_M_start[uVar14].type;
        iVar5 = (*pTVar4->_vptr_TType[0x25])(pTVar4);
        if ((char)iVar5 == '\0') {
LAB_004348ba:
          __assert_fail("isStruct()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                        ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
        }
        pTVar10 = (pTVar4->field_13).structure;
        iVar5 = (*pTVar9->_vptr_TType[0x25])(pTVar9);
        if ((char)iVar5 == '\0') goto LAB_004348ba;
        this_00 = this;
        fixBlockUniformLayoutMatrix(this,qualifier_00,pTVar10,(pTVar9->field_13).structure);
        __fn = (TQualifier *)&this->matrixFixRecord;
        pTVar10 = recordStructCopy(this_00,&this->matrixFixRecord,p_Var1->_M_start[uVar14].type,
                                   pTVar9);
        if (tmpTypeList == (TTypeList *)0x0) {
          pTVar11 = p_Var1->_M_start;
        }
        else {
          pTVar11 = p_Var2->_M_start;
        }
        pTVar9 = pTVar11[uVar14].type;
        iVar5 = (*pTVar9->_vptr_TType[0x25])(pTVar9);
        if ((char)iVar5 == '\0') {
          __assert_fail("isStruct()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                        ,0x9e0,"void glslang::TType::setStruct(TTypeList *)");
        }
        (pTVar9->field_13).structure = pTVar10;
      }
      uVar14 = (ulong)uVar13;
      pTVar7 = (originTypeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar13 = uVar13 + 1;
    } while (uVar14 < (ulong)((long)(originTypeList->
                                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ).
                                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 5))
    ;
  }
  return;
}

Assistant:

void TParseContext::fixBlockUniformLayoutMatrix(TQualifier& qualifier, TTypeList* originTypeList,
                                                TTypeList* tmpTypeList)
{
    assert(tmpTypeList == nullptr || originTypeList->size() == tmpTypeList->size());
    for (unsigned int member = 0; member < originTypeList->size(); ++member) {
        if (qualifier.layoutPacking != ElpNone) {
            if (tmpTypeList == nullptr) {
                if (((*originTypeList)[member].type->isMatrix() ||
                     (*originTypeList)[member].type->getBasicType() == EbtStruct) &&
                    (*originTypeList)[member].type->getQualifier().layoutMatrix == ElmNone) {
                    (*originTypeList)[member].type->getQualifier().layoutMatrix = qualifier.layoutMatrix;
                }
            } else {
                if (((*tmpTypeList)[member].type->isMatrix() ||
                     (*tmpTypeList)[member].type->getBasicType() == EbtStruct) &&
                    (*tmpTypeList)[member].type->getQualifier().layoutMatrix == ElmNone) {
                    (*tmpTypeList)[member].type->getQualifier().layoutMatrix = qualifier.layoutMatrix;
                }
            }
        }

        if ((*originTypeList)[member].type->getBasicType() == EbtStruct) {
            TQualifier* memberQualifier = nullptr;
            // block member can be declare a matrix style, so it should be update to the member's style
            if ((*originTypeList)[member].type->getQualifier().layoutMatrix == ElmNone) {
                memberQualifier = &qualifier;
            } else {
                memberQualifier = &((*originTypeList)[member].type->getQualifier());
            }

            const TType* tmpType = tmpTypeList == nullptr ?
                (*originTypeList)[member].type->clone() : (*tmpTypeList)[member].type;

            fixBlockUniformLayoutMatrix(*memberQualifier, (*originTypeList)[member].type->getWritableStruct(),
                                        tmpType->getWritableStruct());

            const TTypeList* structure = recordStructCopy(matrixFixRecord, (*originTypeList)[member].type, tmpType);

            if (tmpTypeList == nullptr) {
                (*originTypeList)[member].type->setStruct(const_cast<TTypeList*>(structure));
            }
            if (tmpTypeList != nullptr) {
                (*tmpTypeList)[member].type->setStruct(const_cast<TTypeList*>(structure));
            }
        }
    }
}